

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfWav.cpp
# Opt level: O2

void Imf_3_4::wav2Encode(unsigned_short *in,int nx,int ox,int ny,int oy,unsigned_short mx)

{
  unsigned_short *h;
  unsigned_short *h_00;
  unsigned_short uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ushort uVar6;
  uint uVar7;
  long lVar8;
  short sVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  ushort *puVar13;
  unsigned_short *puVar14;
  uint uVar15;
  uint local_b4;
  
  iVar5 = ny;
  if (nx < ny) {
    iVar5 = nx;
  }
  local_b4 = 1;
  for (uVar3 = 2; (int)uVar3 <= iVar5; uVar3 = uVar3 * 2) {
    iVar10 = (nx - uVar3) * ox;
    lVar8 = (long)(int)(local_b4 * ox);
    lVar12 = (long)(int)(local_b4 * oy);
    for (puVar14 = in; puVar14 <= in + (int)((ny - uVar3) * oy);
        puVar14 = puVar14 + (int)(uVar3 * oy)) {
      for (puVar13 = puVar14; puVar13 <= puVar14 + iVar10; puVar13 = puVar13 + (int)(uVar3 * ox)) {
        h = puVar13 + lVar12;
        h_00 = puVar13 + lVar12 + lVar8;
        uVar1 = *puVar13;
        uVar2 = puVar13[lVar8];
        if (mx < 0x4000) {
          sVar9 = *h - *h_00;
          uVar7 = (int)(short)uVar2 + (int)(short)uVar1;
          uVar11 = (int)(short)*h_00 + (int)(short)*h;
          *puVar13 = (unsigned_short)((uint)(((int)uVar11 >> 1) + ((int)uVar7 >> 1)) >> 1);
          *h = (short)(uVar7 >> 1) - (short)(uVar11 >> 1);
          puVar13[lVar8] = (unsigned_short)((uint)((int)sVar9 + (int)(short)(uVar1 - uVar2)) >> 1);
          *h_00 = (uVar1 - uVar2) - sVar9;
        }
        else {
          uVar15 = ((int)(short)uVar1 ^ 0x8000U) & 0xffff;
          uVar11 = uVar15 - uVar2 & 0x8000ffff;
          uVar7 = (*h ^ 0x8000) - (uint)*h_00 & 0x8000ffff;
          anon_unknown_0::wenc16
                    ((ushort)(uVar11 >> 0x10) ^ (ushort)(uVar15 + uVar2 >> 1),
                     (ushort)(uVar7 >> 0x10) ^ (ushort)((*h ^ 0x8000) + (uint)*h_00 >> 1),puVar13,h)
          ;
          anon_unknown_0::wenc16((unsigned_short)uVar11,(unsigned_short)uVar7,puVar13 + lVar8,h_00);
        }
      }
      if ((nx & local_b4) != 0) {
        uVar7 = (uint)(short)*puVar13;
        uVar2 = puVar13[lVar12];
        if (mx < 0x4000) {
          uVar6 = (ushort)((int)(short)uVar2 + uVar7 >> 1);
          iVar4 = uVar7 - (int)(short)uVar2;
        }
        else {
          uVar7 = (uVar7 ^ 0x8000) & 0xffff;
          iVar4 = uVar7 - uVar2;
          uVar6 = (ushort)((uint)iVar4 >> 0x10) & 0x8000 ^ (ushort)(uVar7 + uVar2 >> 1);
        }
        puVar13[lVar12] = (unsigned_short)iVar4;
        *puVar13 = uVar6;
      }
    }
    if ((ny & local_b4) != 0) {
      puVar13 = puVar14 + iVar10;
      for (; puVar14 <= puVar13; puVar14 = puVar14 + (int)(uVar3 * ox)) {
        uVar7 = (uint)(short)*puVar14;
        uVar2 = puVar14[lVar8];
        if (mx < 0x4000) {
          uVar6 = (ushort)((int)(short)uVar2 + uVar7 >> 1);
          iVar10 = uVar7 - (int)(short)uVar2;
        }
        else {
          uVar7 = (uVar7 ^ 0x8000) & 0xffff;
          iVar10 = uVar7 - uVar2;
          uVar6 = (ushort)((uint)iVar10 >> 0x10) & 0x8000 ^ (ushort)(uVar7 + uVar2 >> 1);
        }
        puVar14[lVar8] = (ushort)iVar10;
        *puVar14 = uVar6;
      }
    }
    local_b4 = uVar3;
  }
  return;
}

Assistant:

void
wav2Encode (
    unsigned short* in, // io: values are transformed in place
    int             nx, // i : x size
    int             ox, // i : x offset
    int             ny, // i : y size
    int             oy, // i : y offset
    unsigned short  mx)  // i : maximum in[x][y] value
{
    bool w14 = (mx < (1 << 14));
    int  n   = (nx > ny) ? ny : nx;
    int  p   = 1; // == 1 <<  level
    int  p2  = 2; // == 1 << (level+1)

    //
    // Hierarchical loop on smaller dimension n
    //

    while (p2 <= n)
    {
        unsigned short* py  = in;
        unsigned short* ey  = in + oy * (ny - p2);
        int             oy1 = oy * p;
        int             oy2 = oy * p2;
        int             ox1 = ox * p;
        int             ox2 = ox * p2;
        unsigned short  i00, i01, i10, i11;

        //
        // Y loop
        //

        for (; py <= ey; py += oy2)
        {
            unsigned short* px = py;
            unsigned short* ex = py + ox * (nx - p2);

            //
            // X loop
            //

            for (; px <= ex; px += ox2)
            {
                unsigned short* p01 = px + ox1;
                unsigned short* p10 = px + oy1;
                unsigned short* p11 = p10 + ox1;

                //
                // 2D wavelet encoding
                //

                if (w14)
                {
                    wenc14 (*px, *p01, i00, i01);
                    wenc14 (*p10, *p11, i10, i11);
                    wenc14 (i00, i10, *px, *p10);
                    wenc14 (i01, i11, *p01, *p11);
                }
                else
                {
                    wenc16 (*px, *p01, i00, i01);
                    wenc16 (*p10, *p11, i10, i11);
                    wenc16 (i00, i10, *px, *p10);
                    wenc16 (i01, i11, *p01, *p11);
                }
            }

            //
            // Encode (1D) odd column (still in Y loop)
            //

            if (nx & p)
            {
                unsigned short* p10 = px + oy1;

                if (w14)
                    wenc14 (*px, *p10, i00, *p10);
                else
                    wenc16 (*px, *p10, i00, *p10);

                *px = i00;
            }
        }

        //
        // Encode (1D) odd line (must loop in X)
        //

        if (ny & p)
        {
            unsigned short* px = py;
            unsigned short* ex = py + ox * (nx - p2);

            for (; px <= ex; px += ox2)
            {
                unsigned short* p01 = px + ox1;

                if (w14)
                    wenc14 (*px, *p01, i00, *p01);
                else
                    wenc16 (*px, *p01, i00, *p01);

                *px = i00;
            }
        }

        //
        // Next level
        //

        p = p2;
        p2 <<= 1;
    }
}